

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

LValue * __thiscall
slang::ast::NamedValueExpression::evalLValueImpl
          (LValue *__return_storage_ptr__,NamedValueExpression *this,EvalContext *context)

{
  bool bVar1;
  ConstantValue *base;
  Diagnostic *pDVar2;
  
  bVar1 = checkConstant(this,context);
  if (bVar1) {
    base = EvalContext::findLocal(context,(this->super_ValueExpressionBase).symbol);
    if (base != (ConstantValue *)0x0) {
      LValue::LValue(__return_storage_ptr__,base);
      return __return_storage_ptr__;
    }
    pDVar2 = EvalContext::addDiag
                       (context,(DiagCode)0x15000c,
                        (this->super_ValueExpressionBase).super_Expression.sourceRange);
    pDVar2 = Diagnostic::operator<<
                       (pDVar2,(((this->super_ValueExpressionBase).symbol)->super_Symbol).name);
    Diagnostic::addNote(pDVar2,(DiagCode)0x50001,
                        (((this->super_ValueExpressionBase).symbol)->super_Symbol).location);
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->value).
           super__Variant_base<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_assign_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Move_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Copy_ctor_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
           .
           super__Variant_storage_alias<std::monostate,_slang::ast::LValue::Path,_slang::ast::LValue::Concat>
   + 0x180) = '\0';
  return __return_storage_ptr__;
}

Assistant:

LValue NamedValueExpression::evalLValueImpl(EvalContext& context) const {
    if (!checkConstant(context))
        return nullptr;

    auto cv = context.findLocal(&symbol);
    if (!cv) {
        auto& diag = context.addDiag(diag::ConstEvalNonConstVariable, sourceRange) << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        return nullptr;
    }

    return LValue(*cv);
}